

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

lys_module *
lyp_search_file(ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
               unres_schema *unres)

{
  char cVar1;
  uint8_t uVar2;
  LYS_INFORMAT LVar3;
  int iVar4;
  uint uVar5;
  ly_set *set;
  size_t sVar6;
  lys_node *__name;
  LY_ERR *pLVar7;
  DIR *__dirp;
  int *piVar8;
  size_t sVar9;
  dirent *pdVar10;
  size_t sVar11;
  char *pcVar12;
  lys_module *module_00;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  LYS_INFORMAT format;
  char *__s;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 local_138 [8];
  stat st;
  long local_98;
  char *local_40;
  char *wn;
  
  local_40 = (char *)0x0;
  st.__glibc_reserved[2] = (__syscall_slong_t)unres;
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
    return (lys_module *)0x0;
  }
  sVar6 = strlen(name);
  __name = (lys_node *)get_current_dir_name();
  if (__name == (lys_node *)0x0) {
LAB_001212c8:
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EMEM;
    __name = (lys_node *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
    __dirp = (DIR *)0x0;
LAB_001212f3:
    module_00 = (lys_module *)0x0;
    pcVar15 = (char *)0x0;
    goto LAB_001212f6;
  }
  iVar4 = ly_set_add(set,__name,0);
  if (iVar4 != -1) {
    if ((ctx->models).search_paths == (char **)0x0) {
LAB_00121356:
      lVar16 = sVar6 + 1;
      __name = (lys_node *)0x0;
      __dirp = (DIR *)0x0;
      local_98 = 0;
      wn = (char *)0x0;
      format = LYS_IN_UNKNOWN;
      while (set->number != 0) {
        free(__name);
        free(local_40);
        local_40 = (char *)0x0;
        uVar5 = set->number - 1;
        set->number = uVar5;
        __name = (set->set).s[uVar5];
        (set->set).s[uVar5] = (lys_node *)0x0;
        if ('\x01' < ly_log_level) {
          ly_log(LY_LLVRB,"Searching for \"%s\" in %s.",name);
        }
        if (__dirp != (DIR *)0x0) {
          closedir(__dirp);
        }
        __dirp = opendir((char *)__name);
        if (__dirp == (DIR *)0x0) {
          if ('\0' < ly_log_level) {
            piVar8 = __errno_location();
            strerror(*piVar8);
            ly_log(LY_LLWRN,"Unable to open directory \"%s\" for searching (sub)modules (%s).",
                   __name);
          }
        }
        else {
          sVar9 = strlen((char *)__name);
          LVar3 = format;
LAB_00121443:
          pdVar10 = readdir(__dirp);
          format = LVar3;
          if (pdVar10 != (dirent *)0x0) {
            if ((byte)pdVar10->d_name[0] == 0x2e) goto code_r0x00121460;
            iVar4 = 0x2e - (uint)(byte)pdVar10->d_name[0];
            goto LAB_00121482;
          }
        }
      }
      if (wn == (char *)0x0) {
        if (module == (lys_module *)0x0 && revision == (char *)0x0) {
          module_00 = ly_ctx_get_module(ctx,name,(char *)0x0);
          pcVar15 = (char *)0x0;
          if (module_00 != (lys_module *)0x0) goto LAB_001212f6;
        }
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_ESYS;
        ly_log(LY_LLERR,"Data model \"%s\" not found.",name);
        goto LAB_001212f3;
      }
LAB_001216d7:
      pcVar15 = wn;
      if ('\x01' < ly_log_level) {
        ly_log(LY_LLVRB,"Loading schema from \"%s\" file.",wn);
      }
      pcVar12 = strrchr(pcVar15,0x2e);
      pcVar12[1] = '\0';
      if (revision == (char *)0x0) {
        uVar5 = (ctx->models).used;
        uVar17 = 0;
        uVar18 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar18 = uVar17;
        }
        for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
          module_00 = (ctx->models).list[uVar17];
          pcVar15 = module_00->filepath;
          if ((pcVar15 != (char *)0x0) && (iVar4 = strcmp(name,module_00->name), iVar4 == 0)) {
            sVar6 = strlen(wn);
            iVar4 = strncmp(wn,pcVar15,sVar6);
            pcVar15 = wn;
            if (iVar4 == 0) {
              if ((implement == 0) || ((char)module_00->field_0x40 < '\0')) {
                if ((module_00->field_0x40 & 0x40) != 0) {
                  lys_set_enabled(module_00);
                }
              }
              else {
                iVar4 = lys_set_implemented(module_00);
                pcVar15 = wn;
                if (iVar4 != 0) {
                  module_00 = (lys_module *)0x0;
                }
              }
              goto LAB_001212f6;
            }
          }
        }
      }
      pcVar15 = wn;
      pcVar12[1] = 'y';
      iVar4 = open(wn,0);
      if (iVar4 < 0) {
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_ESYS;
        piVar8 = __errno_location();
        pcVar12 = strerror(*piVar8);
        ly_log(LY_LLERR,"Unable to open data model file \"%s\" (%s).",pcVar15,pcVar12);
        module_00 = (lys_module *)0x0;
        goto LAB_001212f6;
      }
      wn = pcVar15;
      if (module == (lys_module *)0x0) {
        module_00 = lys_read_import(ctx,iVar4,format,revision,implement);
      }
      else {
        module_00 = (lys_module *)
                    lys_sub_parse_fd(module,iVar4,format,(unres_schema *)st.__glibc_reserved[2]);
      }
      close(iVar4);
      pcVar15 = wn;
      if (module_00 == (lys_module *)0x0) {
LAB_001219d1:
        module_00 = (lys_module *)0x0;
        pcVar15 = wn;
        goto LAB_001212f6;
      }
      pcVar13 = strrchr(wn,0x2f);
      __s = pcVar13 + 1;
      if (pcVar13 == (char *)0x0) {
        __s = pcVar15;
      }
      pcVar13 = strchr(__s,0x40);
      pcVar15 = module_00->name;
      sVar6 = strlen(pcVar15);
      iVar4 = strncmp(__s,pcVar15,sVar6);
      if (iVar4 == 0) {
        pcVar14 = pcVar13;
        if (pcVar13 == (char *)0x0) {
          pcVar14 = pcVar12;
        }
        if (__s + sVar6 != pcVar14) goto LAB_0012191a;
      }
      else {
LAB_0012191a:
        if ('\0' < ly_log_level) {
          ly_log(LY_LLWRN,"File name \"%s\" does not match module name \"%s\".",__s,pcVar15);
        }
      }
      pcVar15 = wn;
      if (((pcVar13 != (char *)0x0) &&
          (((uVar2 = module_00->rev_size, uVar2 == '\0' ||
            ((long)pcVar12 - (long)(pcVar13 + 1) != 10)) ||
           (iVar4 = strncmp(module_00->rev->date,pcVar13 + 1,10), iVar4 != 0)))) &&
         ('\0' < ly_log_level)) {
        if (uVar2 == '\0') {
          pcVar12 = "none";
        }
        else {
          pcVar12 = module_00->rev->date;
        }
        ly_log(LY_LLWRN,"File name \"%s\" does not match module revision \"%s\".",__s,pcVar12);
      }
      pcVar15 = lydict_insert_zc(ctx,pcVar15);
      module_00->filepath = pcVar15;
      pcVar15 = (char *)0x0;
      goto LAB_001212f6;
    }
    lVar16 = 0;
    do {
      pcVar15 = *(char **)((long)(ctx->models).search_paths + lVar16);
      if (pcVar15 == (char *)0x0) goto LAB_00121356;
      __name = (lys_node *)strdup(pcVar15);
      if (__name == (lys_node *)0x0) goto LAB_001212c8;
      iVar4 = ly_set_add(set,__name,0);
      lVar16 = lVar16 + 8;
    } while (iVar4 != -1);
  }
  __dirp = (DIR *)0x0;
  module_00 = (lys_module *)0x0;
  pcVar15 = (char *)0x0;
LAB_001212f6:
  free(local_40);
  free(__name);
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  free(pcVar15);
  for (uVar18 = 0; uVar18 < set->number; uVar18 = uVar18 + 1) {
    free((set->set).s[uVar18]);
  }
  ly_set_free(set);
  return module_00;
code_r0x00121460:
  if (pdVar10->d_name[1] != '\0') {
    uVar5 = (byte)pdVar10->d_name[1] - 0x2e;
    if (uVar5 == 0) {
      uVar5 = (uint)(byte)pdVar10->d_name[2];
    }
    iVar4 = -uVar5;
LAB_00121482:
    if (iVar4 != 0) {
      pcVar15 = pdVar10->d_name;
      free(local_40);
      iVar4 = asprintf(&local_40,"%s/%s",__name);
      if (iVar4 == -1) {
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
        goto LAB_001219d1;
      }
      iVar4 = stat(local_40,(stat *)local_138);
      if (iVar4 == -1) {
        if ('\0' < ly_log_level) {
          piVar8 = __errno_location();
          pcVar12 = strerror(*piVar8);
          ly_log(LY_LLWRN,
                 "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                 ,pcVar15,__name,pcVar12);
        }
      }
      else if (((uint)st.st_nlink & 0xf000) == 0x8000) {
        iVar4 = strncmp(name,pcVar15,sVar6);
        if ((iVar4 == 0) && ((cVar1 = pcVar15[sVar6], cVar1 == '@' || (cVar1 == '.')))) {
          sVar11 = strlen(pcVar15);
          iVar4 = strcmp(pcVar15 + (sVar11 - 4),".yin");
          format = LYS_IN_YIN;
          if (iVar4 != 0) {
            iVar4 = strcmp(pcVar15 + (sVar11 - 5),".yang");
            format = LYS_IN_YANG;
            if (iVar4 != 0) goto LAB_00121443;
          }
          if (revision == (char *)0x0) {
            if (wn != (char *)0x0) {
              if (cVar1 != '@') goto LAB_00121443;
              iVar4 = lyp_check_date(pcVar15 + lVar16);
              if ((iVar4 != 0) ||
                 ((wn[local_98] == '@' &&
                  (iVar4 = strncmp(wn + local_98 + 1,pcVar15 + lVar16,10), -1 < iVar4))))
              goto LAB_00121443;
              free(wn);
            }
            wn = local_40;
            local_40 = (char *)0x0;
            local_98 = sVar9 + lVar16;
            LVar3 = format;
            goto LAB_00121443;
          }
          if (cVar1 == '@') {
            sVar11 = strlen(revision);
            iVar4 = strncmp(revision,pcVar15 + lVar16,sVar11);
            if (iVar4 == 0) {
              free(wn);
              wn = local_40;
              local_40 = (char *)0x0;
              goto LAB_001216d7;
            }
          }
          else {
            free(wn);
            wn = local_40;
            local_40 = (char *)0x0;
            local_98 = sVar9 + lVar16;
            LVar3 = format;
          }
        }
      }
      else if ((((uint)st.st_nlink & 0xf000) == 0x4000) && (set->number != 0)) {
        iVar4 = ly_set_add(set,local_40,0);
        if (iVar4 == -1) goto LAB_001219d1;
        local_40 = (char *)0x0;
      }
    }
  }
  goto LAB_00121443;
}

Assistant:

struct lys_module *
lyp_search_file(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                int implement, struct unres_schema *unres)
{
    size_t len, flen, match_len = 0, dir_len;
    int fd, i;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL, *dot, *rev, *filename;
    LYS_INFORMAT format, match_format = 0;
    struct lys_module *result = NULL;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM;
        return NULL;
    }

    len = strlen(name);
    wd = get_current_dir_name();
    if (!wd) {
        LOGMEM;
        goto cleanup;
    } else if (ly_set_add(dirs, wd, 0) == -1) {
        goto cleanup;
    }
    if (ctx->models.search_paths) {
        for (i = 0; ctx->models.search_paths[i]; i++) {
            wd = strdup(ctx->models.search_paths[i]);
            if (!wd) {
                LOGMEM;
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN("Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM;
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN("Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && dirs->number) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format;
                            goto matched;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(&file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format;
                    continue;
                }
            }
        }
    }

    if (!match_name) {
        if (!module && !revision) {
            /* otherwise the module would be already taken from the context */
            result = (struct lys_module *)ly_ctx_get_module(ctx, name, revision);
        }
        if (!result) {
            LOGERR(LY_ESYS, "Data model \"%s\" not found.", name);
        }
        goto cleanup;
    }

matched:
    LOGVRB("Loading schema from \"%s\" file.", match_name);

    /* cut the format for now */
    dot = strrchr(match_name, '.');
    dot[1] = '\0';

    /* check that the same file was not already loaded - it make sense only in case of loading the newest revision,
     * search also in disabled module - if the matching module is disabled, it will be enabled instead of loading it */
    if (!revision) {
        for (i = 0; i < ctx->models.used; ++i) {
            if (ctx->models.list[i]->filepath && !strcmp(name, ctx->models.list[i]->name)
                    && !strncmp(match_name, ctx->models.list[i]->filepath, strlen(match_name))) {
                result = ctx->models.list[i];
                if (implement && !result->implemented) {
                    /* make it implemented now */
                    if (lys_set_implemented(result)) {
                        result = NULL;
                    }
                } else if (result->disabled) {
                    lys_set_enabled(result);
                }

                goto cleanup;
            }
        }
    }

    /* add the format back */
    dot[1] = 'y';

    /* open the file */
    fd = open(match_name, O_RDONLY);
    if (fd < 0) {
        LOGERR(LY_ESYS, "Unable to open data model file \"%s\" (%s).",
               match_name, strerror(errno));
        goto cleanup;
    }

    if (module) {
        result = (struct lys_module *)lys_sub_parse_fd(module, fd, match_format, unres);
    } else {
        result = lys_read_import(ctx, fd, match_format, revision, implement);
    }
    close(fd);

    if (!result) {
        goto cleanup;
    }

    /* check that name and revision match filename */
    filename = strrchr(match_name, '/');
    if (!filename) {
        filename = match_name;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    /* name */
    len = strlen(result->name);
    if (strncmp(filename, result->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN("File name \"%s\" does not match module name \"%s\".", filename, result->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!result->rev_size || len != 10 || strncmp(result->rev[0].date, rev, len)) {
            LOGWRN("File name \"%s\" does not match module revision \"%s\".", filename,
                   result->rev_size ? result->rev[0].date : "none");
        }
    }

    result->filepath = lydict_insert_zc(ctx, match_name);
    match_name = NULL;
    /* success */

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return result;
}